

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O1

void __thiscall QtMWidgets::SwitchPrivate::setState(SwitchPrivate *this,State st)

{
  int iVar1;
  QStyleOption opt;
  QStyleOption aQStack_58 [16];
  uint local_48;
  int local_40;
  
  if (this->state == st) {
    return;
  }
  this->state = st;
  iVar1 = 0;
  QStyleOption::QStyleOption(aQStack_58,1,0);
  QStyleOption::initFrom((QWidget *)aQStack_58);
  if (AcceptedUncheck < this->state) {
    if (1 < this->state - NotAcceptedCheck) goto LAB_0016c114;
    iVar1 = ~local_48 + local_40 + this->radius * -2;
  }
  this->offset = iVar1;
LAB_0016c114:
  emitSignals(this);
  QWidget::update();
  QStyleOption::~QStyleOption(aQStack_58);
  return;
}

Assistant:

void
SwitchPrivate::setState( Switch::State st )
{
	if( state != st )
	{
		state = st;

		QStyleOption opt;
		opt.initFrom( q );

		initOffset( opt.rect );

		emitSignals();

		q->update();
	}
}